

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::EBMLHeader::Init(EBMLHeader *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 1;
  in_RDI[1] = 1;
  in_RDI[2] = 4;
  in_RDI[3] = 8;
  if (in_RDI[4] != 0) {
    if ((void *)in_RDI[4] != (void *)0x0) {
      operator_delete__((void *)in_RDI[4]);
    }
    in_RDI[4] = 0;
  }
  in_RDI[5] = 1;
  in_RDI[6] = 1;
  return;
}

Assistant:

void EBMLHeader::Init() {
  m_version = 1;
  m_readVersion = 1;
  m_maxIdLength = 4;
  m_maxSizeLength = 8;

  if (m_docType) {
    delete[] m_docType;
    m_docType = NULL;
  }

  m_docTypeVersion = 1;
  m_docTypeReadVersion = 1;
}